

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteInt64
               (int field_number,int64 value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  if (uVar7 < 0x80) {
    *pbVar2 = (byte)uVar7;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar7 | 0x80;
    if (uVar7 < 0x4000) {
      pbVar2[1] = (byte)(uVar7 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar1);
      *pbVar3 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  if ((ulong)value < 0x80) {
    *pbVar2 = (byte)value;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)value | 0x80;
    if ((ulong)value < 0x4000) {
      pbVar2[1] = (byte)((ulong)value >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar5 = (ulong)value >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar1);
      *pbVar3 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

void WireFormatLite::WriteInt64(int field_number, int64 value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteInt64NoTag(value, output);
}